

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

int checktz(char *check,size_t len)

{
  int iVar1;
  size_t sVar2;
  size_t ilen;
  tzinfo *what;
  uint i;
  size_t len_local;
  char *check_local;
  
  ilen = (size_t)tz;
  if (len < 5) {
    for (what._4_4_ = 0; what._4_4_ < 0x45; what._4_4_ = what._4_4_ + 1) {
      sVar2 = strlen((char *)ilen);
      if ((sVar2 == len) && (iVar1 = curl_strnequal(check,(char *)ilen,len), iVar1 != 0)) {
        return *(int *)(ilen + 8) * 0x3c;
      }
      ilen = ilen + 0xc;
    }
  }
  return -1;
}

Assistant:

static int checktz(const char *check, size_t len)
{
  unsigned int i;
  const struct tzinfo *what = tz;
  if(len > 4) /* longer than any valid timezone */
    return -1;

  for(i = 0; i < sizeof(tz)/sizeof(tz[0]); i++) {
    size_t ilen = strlen(what->name);
    if((ilen == len) &&
       strncasecompare(check, what->name, len))
      return what->offset*60;
    what++;
  }
  return -1;
}